

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* tlx::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *into,char *sep,size_t sep_size,string *str,size_type limit)

{
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer __s2;
  size_t __len;
  const_iterator it;
  const_iterator last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(into,(into->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  if (limit != 0) {
    if (sep_size == 0) {
      local_48._M_current = (str->_M_dataplus)._M_p;
      if (str->_M_string_length != 0) {
        do {
          local_40._M_current = local_48._M_current + 1;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,
                     &local_48,&local_40);
          local_48._M_current = local_48._M_current + 1;
        } while (local_48._M_current != (str->_M_dataplus)._M_p + str->_M_string_length);
      }
    }
    else {
      __s2 = (str->_M_dataplus)._M_p;
      pcVar2 = __s2 + sep_size;
      local_40._M_current = __s2;
      while (pcVar3 = (str->_M_dataplus)._M_p + str->_M_string_length, local_48._M_current = __s2,
            pcVar2 < pcVar3) {
        iVar1 = bcmp(sep,__s2,sep_size);
        if (iVar1 == 0) {
          if (limit <= ((long)(into->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(into->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) + 1U) break;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,
                     &local_40,&local_48);
          local_40._M_current = local_48._M_current + sep_size;
        }
        __s2 = local_48._M_current + 1;
        pcVar2 = local_48._M_current + sep_size + 1;
      }
      local_38._M_current = pcVar3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,&local_40
                 ,&local_38);
    }
  }
  return into;
}

Assistant:

static inline
std::vector<std::string>& split(
    std::vector<std::string>* into,
    const char* sep, size_t sep_size, const std::string& str,
    std::string::size_type limit) {

    into->clear();
    if (limit == 0) return *into;

    if (sep_size == 0)
    {
        std::string::const_iterator it = str.begin();
        while (it != str.end()) {
            into->emplace_back(it, it + 1);
            ++it;
        }
        return *into;
    }

    std::string::const_iterator it = str.begin(), last = it;

    for ( ; it + sep_size < str.end(); ++it)
    {
        if (std::equal(sep, sep + sep_size, it))
        {
            if (into->size() + 1 >= limit)
            {
                into->emplace_back(last, str.end());
                return *into;
            }

            into->emplace_back(last, it);
            last = it + sep_size;
        }
    }

    into->emplace_back(last, str.end());

    return *into;
}